

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::validForwardSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int *newSol1,int *newSol2,int *worseSol)

{
  int *x;
  pointer piVar1;
  pointer pMVar2;
  pointer pFVar3;
  ulong uVar4;
  double *pdVar5;
  X *pXVar6;
  ulong uVar7;
  Scal *pSVar8;
  long lVar9;
  int k;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Vec T;
  Vec sumWsq;
  Vec dist;
  double local_90;
  void *local_88 [2];
  void *local_78 [2];
  Matrix<double,__1,_1,_0,__1,_1> local_68;
  int *local_58;
  int *local_50;
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  local_48 [2];
  undefined8 local_38;
  
  x = &this->M;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_68,x);
  local_48[0].m_df = (double)(long)this->nSolFound;
  local_38 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_88,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_48);
  local_48[0].m_df = (double)(long)this->nSolFound;
  local_38 = 0;
  local_50 = newSol1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_78,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_48);
  piVar1 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (this->predictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data;
  lVar9 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  uVar7 = 0;
  uVar4 = (ulong)(uint)this->M;
  if (this->M < 1) {
    uVar4 = uVar7;
  }
  pSVar8 = &(((this->experts).
              super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              .
              super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert<1,_1>).p_z_T;
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    lVar10 = (long)piVar1[uVar7];
    dVar11 = (double)(((X *)(pSVar8 + 6))->
                     super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage -
             (double)pMVar2[lVar10].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                     m_storage;
    dVar11 = *pdVar5 * dVar11 * dVar11;
    local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar7]
         = dVar11;
    *(double *)((long)local_88[0] + lVar10 * 8) =
         dVar11 + *(double *)((long)local_88[0] + lVar10 * 8);
    *(double *)((long)local_78[0] + lVar10 * 8) =
         *pSVar8 * *pSVar8 + *(double *)((long)local_78[0] + lVar10 * 8);
    pSVar8 = pSVar8 + 0x35;
    pdVar5 = pdVar5 + lVar9;
  }
  *worseSol = -1;
  lVar9 = 0;
  local_90 = -1.0;
  local_58 = newSol2;
  for (lVar10 = 0; lVar10 < this->nSolFound; lVar10 = lVar10 + 1) {
    dVar11 = *(double *)
              ((long)(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data + lVar9);
    dVar11 = (dVar11 * dVar11) / *(double *)((long)local_78[0] + lVar9) + -1.0 + 1.0;
    if ((1.0 <= dVar11) && (0.0 < *(double *)((long)local_88[0] + lVar9))) {
      boost::math::
      chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::chi_squared_distribution(local_48,dVar11);
      dVar11 = boost::math::
               cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                         (local_48,(double *)((long)local_88[0] + lVar9));
      if (local_90 <= dVar11) {
        *worseSol = (int)lVar10;
        local_90 = dVar11;
      }
    }
    lVar9 = lVar9 + 8;
  }
  dVar11 = (this->param).multiValuedSignificance;
  if (dVar11 < local_90) {
    piVar1 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar12 = -1.0;
    for (lVar9 = 0; uVar4 = (ulong)*x, lVar9 < (long)uVar4; lVar9 = lVar9 + 1) {
      if ((piVar1[lVar9] == *worseSol) &&
         (dVar13 = local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data[lVar9], dVar12 < dVar13)) {
        *local_50 = (int)lVar9;
        dVar12 = dVar13;
      }
    }
    pFVar3 = (this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             .
             super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar1 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    lVar9 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    pXVar6 = &(pFVar3->super_LinearExpert<1,_1>).pred_x;
    dVar12 = -1.0;
    for (lVar10 = 0; lVar10 < (int)uVar4; lVar10 = lVar10 + 1) {
      if ((piVar1[lVar10] == *worseSol) &&
         (dVar13 = (double)(pXVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                           m_storage -
                   (double)pFVar3[*local_50].super_LinearExpert<1,_1>.pred_x.
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage,
         dVar13 = *pdVar5 * dVar13 * dVar13, dVar12 < dVar13)) {
        *local_58 = (int)lVar10;
        uVar4 = (ulong)(uint)*x;
        dVar12 = dVar13;
      }
      pdVar5 = pdVar5 + lVar9;
      pXVar6 = pXVar6 + 0x35;
    }
  }
  free(local_78[0]);
  free(local_88[0]);
  free(local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return local_90 <= dVar11;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validForwardSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    X diffX;
    Vec dist(M);
    Vec T = Vec::Zero(nSolFound);
    Vec sumWsq = Vec::Zero(nSolFound);
    for(int j = 0; j < M; j++)
    {
        diffX = experts[j].getPredX() - predictions[sNearest[j]];
        dist(j) = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);

        T[sNearest[j]] += dist(j);
        sumWsq(sNearest[j]) += experts[j].get_p_z()*experts[j].get_p_z();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;

    for(int k = 0; k < nSolFound; k++)
    {
        Scal dof = (sum_p_z(k) * sum_p_z(k) / sumWsq(k) - 1.0) * D;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dMax = -1.0;
        for(int j = 0; j < M; j++)
            if( (sNearest[j] == worseSol) && (dist(j) > dMax) )
            {
                dMax = dist(j);
                newSol1 = j;
            }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        Scal dist2;
        for(int j = 0; j < M; j++)
            if( sNearest[j] == worseSol )
            {
                diffX = experts[j].getPredX() - experts[newSol1].getPredX();
                dist2 = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);
                if( dist2 > dMax )
                {
                    dMax = dist2;
                    newSol2 = j;
                }
            }

        return false;
    }
}